

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

void __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
::parser::unexpect(parser *this,token_type t)

{
  invalid_argument *this_00;
  bool local_b2;
  string_t local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  allocator local_39;
  string local_38 [8];
  string error_msg;
  token_type t_local;
  parser *this_local;
  
  if (t == this->last_token) {
    error_msg.field_2._12_4_ = t;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"parse error - unexpected ",&local_39);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    local_b2 = this->last_token != parse_error;
    if (local_b2) {
      lexer::token_type_name(&local_70,this->last_token);
    }
    else {
      lexer::get_token_string(&local_b0,&this->m_lexer);
      std::operator+(&local_90,"\'",&local_b0);
      std::operator+(&local_70,&local_90,"\'");
    }
    local_b2 = !local_b2;
    std::__cxx11::string::operator+=(local_38,(string *)&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    if (local_b2) {
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,local_38);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

void unexpect(typename lexer::token_type t) const
        {
            if (t == last_token)
            {
                std::string error_msg = "parse error - unexpected ";
                error_msg += (last_token == lexer::token_type::parse_error ? ("'" +  m_lexer.get_token_string() +
                              "'") :
                              lexer::token_type_name(last_token));
                JSON_THROW(std::invalid_argument(error_msg));
            }
        }